

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O0

bool verifyResult(string *objI,string *objJ,double distance,double penetration,Point3 *p1,Point3 *p2
                 )

{
  double a;
  Point3 *a_00;
  bool bVar1;
  byte local_9da;
  byte local_9c2;
  byte local_9aa;
  byte local_99a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  double local_780;
  double pepsilon;
  double epsilon;
  double dStack_768;
  bool res;
  double local_760;
  double local_758;
  double local_750;
  double local_748;
  double local_740;
  double local_738;
  double local_730;
  double local_728;
  double local_720;
  double local_718;
  double local_710;
  double local_708;
  double local_700;
  double local_6f8;
  double local_6f0;
  double local_6e8;
  double local_6e0;
  double local_6d8;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  double local_6b8;
  double local_6b0;
  double local_6a8;
  double local_6a0;
  double local_698;
  double local_690;
  double local_688;
  double local_680;
  double local_678;
  double local_670;
  double local_668;
  double local_660;
  double local_658;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  double local_608;
  double local_600;
  double local_5f8;
  double local_5f0;
  double local_5e8;
  double local_5e0;
  double local_5d8;
  double local_5d0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  double local_590;
  double local_588;
  double local_580;
  double local_578;
  double local_570;
  double local_568;
  double local_560;
  double local_558;
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  double local_528;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  double local_460;
  double local_458;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined1 local_90 [8];
  Point3 dp2;
  double local_70;
  double local_68;
  undefined1 local_60 [8];
  Point3 dp1;
  double pd;
  double dd;
  Point3 *p2_local;
  Point3 *p1_local;
  double penetration_local;
  double distance_local;
  string *objJ_local;
  string *objI_local;
  
  dd = (double)p2;
  p2_local = p1;
  p1_local = (Point3 *)penetration;
  penetration_local = distance;
  distance_local = (double)objJ;
  objJ_local = objI;
  std::ios_base::precision((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),0xe);
  pd = 0.0;
  dp1.m_z = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  dp2.m_z = 0.0;
  CD_Matrix::Vector3T<double,_false>::Vector3T
            ((Vector3T<double,_false> *)local_60,&local_68,&local_70,&dp2.m_z);
  local_98 = 0.0;
  local_a0 = 0.0;
  local_a8 = 0.0;
  CD_Matrix::Vector3T<double,_false>::Vector3T
            ((Vector3T<double,_false> *)local_90,&local_98,&local_a0,&local_a8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          distance_local,"super1");
  if ((bVar1) && (bVar1 = std::operator==(objJ_local,"super2"), bVar1)) {
    pd = 5.4487471575136;
    dp1.m_z = 5.4487471575136;
    local_b0 = 0.28175284289769;
    local_b8 = -0.14299067182235;
    local_c0 = 1.1716656444909;
    CD_Matrix::Vector3T<double,_false>::Set
              ((Vector3T<double,_false> *)local_60,&local_b0,&local_b8,&local_c0);
    local_c8 = -1.7636106455221;
    local_d0 = -1.2250286690872;
    local_d8 = 1.4789588761567;
    CD_Matrix::Vector3T<double,_false>::Set
              ((Vector3T<double,_false> *)local_90,&local_c8,&local_d0,&local_d8);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            distance_local,"super1");
    if ((bVar1) && (bVar1 = std::operator==(objJ_local,"super3"), bVar1)) {
      pd = 0.30421039852355;
      dp1.m_z = 0.30421039852355;
      local_e0 = 0.96363716178523;
      local_e8 = 0.46511130288262;
      local_f0 = -0.52236418422971;
      CD_Matrix::Vector3T<double,_false>::Set
                ((Vector3T<double,_false> *)local_60,&local_e0,&local_e8,&local_f0);
      local_f8 = 0.98382992853513;
      local_100 = 0.57131577169444;
      local_108 = -1.0632183803851;
      CD_Matrix::Vector3T<double,_false>::Set
                ((Vector3T<double,_false> *)local_90,&local_f8,&local_100,&local_108);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              distance_local,"super2");
      if ((bVar1) && (bVar1 = std::operator==(objJ_local,"super3"), bVar1)) {
        pd = 9.9181149823984;
        dp1.m_z = 9.9181149823984;
        local_110 = -2.2982641001418;
        local_118 = -0.53893477159955;
        local_120 = 1.0585206046519;
        CD_Matrix::Vector3T<double,_false>::Set
                  ((Vector3T<double,_false> *)local_60,&local_110,&local_118,&local_120);
        local_128 = -0.63840167210456;
        local_130 = -0.44938462670065;
        local_138 = -1.6163536865882;
        CD_Matrix::Vector3T<double,_false>::Set
                  ((Vector3T<double,_false> *)local_90,&local_128,&local_130,&local_138);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )distance_local,"super1");
        if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box1"), bVar1)) {
          pd = 0.55758708510798;
          dp1.m_z = 0.55758708510798;
          local_140 = 0.61084807024591;
          local_148 = 0.29440863418974;
          local_150 = 0.069803781161034;
          CD_Matrix::Vector3T<double,_false>::Set
                    ((Vector3T<double,_false> *)local_60,&local_140,&local_148,&local_150);
          local_158 = -0.056687617849561;
          local_160 = 0.13575086229484;
          local_168 = -0.22483311680702;
          CD_Matrix::Vector3T<double,_false>::Set
                    ((Vector3T<double,_false> *)local_90,&local_158,&local_160,&local_168);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)distance_local,"super2");
          if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box1"), bVar1)) {
            pd = 5.9443143905268;
            dp1.m_z = 5.9443143905268;
            local_170 = -2.1732498476818;
            local_178 = -0.63004749575528;
            local_180 = 1.1490992568704;
            CD_Matrix::Vector3T<double,_false>::Set
                      ((Vector3T<double,_false> *)local_60,&local_170,&local_178,&local_180);
            local_188 = -0.27631829569933;
            local_190 = 0.12220296114932;
            local_198 = -0.18509875231225;
            CD_Matrix::Vector3T<double,_false>::Set
                      ((Vector3T<double,_false> *)local_90,&local_188,&local_190,&local_198);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)distance_local,"super3");
            if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box1"), bVar1)) {
              pd = 0.51584655618165;
              dp1.m_z = 0.51584655618165;
              local_1a0 = 0.12785132793314;
              local_1a8 = 0.015765330308717;
              local_1b0 = -1.2847741886342;
              CD_Matrix::Vector3T<double,_false>::Set
                        ((Vector3T<double,_false> *)local_60,&local_1a0,&local_1a8,&local_1b0);
              local_1b8 = -0.12368170430067;
              local_1c0 = 0.077797038850676;
              local_1c8 = -0.61490124768775;
              CD_Matrix::Vector3T<double,_false>::Set
                        ((Vector3T<double,_false> *)local_90,&local_1b8,&local_1c0,&local_1c8);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)distance_local,"super1");
              if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box2"), bVar1)) {
                pd = 2.78972586142;
                dp1.m_z = 2.78972586142;
                local_1d0 = 0.27677566692662;
                local_1d8 = -0.13314609360976;
                local_1e0 = 1.1658328403376;
                CD_Matrix::Vector3T<double,_false>::Set
                          ((Vector3T<double,_false> *)local_60,&local_1d0,&local_1d8,&local_1e0);
                local_1e8 = -1.2995880118717;
                local_1f0 = -0.57154615294118;
                local_1f8 = 1.5014051895616;
                CD_Matrix::Vector3T<double,_false>::Set
                          ((Vector3T<double,_false> *)local_90,&local_1e8,&local_1f0,&local_1f8);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)distance_local,"super2");
                if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box2"), bVar1)) {
                  dp1.m_z = 0.0;
                  pd = -0.31718567003746;
                  local_200 = -1.787265308154;
                  local_208 = -1.1960497354292;
                  local_210 = 1.4450521781144;
                  CD_Matrix::Vector3T<double,_false>::Set
                            ((Vector3T<double,_false> *)local_60,&local_200,&local_208,&local_210);
                  local_218 = -2.2686354608106;
                  local_220 = -1.3706878827971;
                  local_228 = 1.6795089196526;
                  CD_Matrix::Vector3T<double,_false>::Set
                            ((Vector3T<double,_false> *)local_90,&local_218,&local_220,&local_228);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)distance_local,"super3");
                  if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box2"), bVar1)) {
                    pd = 3.440763819841;
                    dp1.m_z = 3.440763819841;
                    local_230 = -0.83748878593566;
                    local_238 = -0.54621539306324;
                    local_240 = -1.7742688055859;
                    CD_Matrix::Vector3T<double,_false>::Set
                              ((Vector3T<double,_false> *)local_60,&local_230,&local_238,&local_240)
                    ;
                    local_248 = -2.060158969655;
                    local_250 = -0.96192382874358;
                    local_258 = -0.44271785342942;
                    CD_Matrix::Vector3T<double,_false>::Set
                              ((Vector3T<double,_false> *)local_90,&local_248,&local_250,&local_258)
                    ;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)distance_local,"box1");
                    if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box2"), bVar1)) {
                      pd = 3.1102603339576;
                      dp1.m_z = 3.1102603339576;
                      local_260 = -0.27631829569933;
                      local_268 = 0.12220296114932;
                      local_270 = -0.18509875231225;
                      CD_Matrix::Vector3T<double,_false>::Set
                                ((Vector3T<double,_false> *)local_60,&local_260,&local_268,
                                 &local_270);
                      local_278 = -1.6979671687682;
                      local_280 = -0.58899718550305;
                      local_288 = 0.57868732183491;
                      CD_Matrix::Vector3T<double,_false>::Set
                                ((Vector3T<double,_false> *)local_90,&local_278,&local_280,
                                 &local_288);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)distance_local,"super1");
                      if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box3"), bVar1)) {
                        pd = 0.14762346168417;
                        dp1.m_z = 0.14762346168417;
                        local_290 = 0.29961124339566;
                        local_298 = 0.014926401743127;
                        local_2a0 = 0.97819026233414;
                        CD_Matrix::Vector3T<double,_false>::Set
                                  ((Vector3T<double,_false> *)local_60,&local_290,&local_298,
                                   &local_2a0);
                        local_2a8 = -0.067084392233482;
                        local_2b0 = 0.11181124267447;
                        local_2b8 = 0.91678097889576;
                        CD_Matrix::Vector3T<double,_false>::Set
                                  ((Vector3T<double,_false> *)local_90,&local_2a8,&local_2b0,
                                   &local_2b8);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)distance_local,"super2");
                        if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box3"), bVar1)) {
                          dp1.m_z = 0.0;
                          pd = -0.88486848336054;
                          local_2c0 = -1.8258028062901;
                          local_2c8 = -1.2035457346373;
                          local_2d0 = 1.5672994449862;
                          CD_Matrix::Vector3T<double,_false>::Set
                                    ((Vector3T<double,_false> *)local_60,&local_2c0,&local_2c8,
                                     &local_2d0);
                          local_2d8 = -2.0099706249296;
                          local_2e0 = -1.6772532880947;
                          local_2e8 = 0.77574916121672;
                          CD_Matrix::Vector3T<double,_false>::Set
                                    ((Vector3T<double,_false> *)local_90,&local_2d8,&local_2e0,
                                     &local_2e8);
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super3");
                          if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box3"), bVar1)) {
                            pd = 1.2943618702035;
                            dp1.m_z = 1.2943618702035;
                            local_2f0 = -0.2536866871953;
                            local_2f8 = -0.23957739656524;
                            local_300 = -1.4216076267573;
                            CD_Matrix::Vector3T<double,_false>::Set
                                      ((Vector3T<double,_false> *)local_60,&local_2f0,&local_2f8,
                                       &local_300);
                            local_308 = -0.65088388966599;
                            local_310 = -0.31132657081448;
                            local_318 = -0.35791203658708;
                            CD_Matrix::Vector3T<double,_false>::Set
                                      ((Vector3T<double,_false> *)local_90,&local_308,&local_310,
                                       &local_318);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box1");
                            if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box3"), bVar1)) {
                              pd = 0.16648542041871;
                              dp1.m_z = 0.16648542041871;
                              local_320 = -0.27631829569933;
                              local_328 = 0.12220296114932;
                              local_330 = -0.18509875231225;
                              CD_Matrix::Vector3T<double,_false>::Set
                                        ((Vector3T<double,_false> *)local_60,&local_320,&local_328,
                                         &local_330);
                              local_338 = -0.54770561715496;
                              local_340 = -0.10725192694837;
                              local_348 = 0.015362706576795;
                              CD_Matrix::Vector3T<double,_false>::Set
                                        ((Vector3T<double,_false> *)local_90,&local_338,&local_340,
                                         &local_348);
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box2");
                              if ((bVar1) && (bVar1 = std::operator==(objJ_local,"box3"), bVar1)) {
                                dp1.m_z = 0.0;
                                pd = -1.7306786763394;
                                local_350 = -1.1518981590561;
                                local_358 = -1.0179317129611;
                                local_360 = 1.6120145906702;
                                CD_Matrix::Vector3T<double,_false>::Set
                                          ((Vector3T<double,_false> *)local_60,&local_350,&local_358
                                           ,&local_360);
                                local_368 = -2.0999010779384;
                                local_370 = -0.15510256812534;
                                local_378 = 1.3162190380463;
                                CD_Matrix::Vector3T<double,_false>::Set
                                          ((Vector3T<double,_false> *)local_90,&local_368,&local_370
                                           ,&local_378);
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super1");
                                if ((bVar1) &&
                                   (bVar1 = std::operator==(objJ_local,"sphere1"), bVar1)) {
                                  pd = 5.3186326388713;
                                  dp1.m_z = 5.3186326388713;
                                  local_380 = 0.3354800425203;
                                  local_388 = 0.22033997371372;
                                  local_390 = 1.0949514789063;
                                  CD_Matrix::Vector3T<double,_false>::Set
                                            ((Vector3T<double,_false> *)local_60,&local_380,
                                             &local_388,&local_390);
                                  local_398 = -1.8196178883092;
                                  local_3a0 = 0.99878520299519;
                                  local_3a8 = 0.83378376954228;
                                  CD_Matrix::Vector3T<double,_false>::Set
                                            ((Vector3T<double,_false> *)local_90,&local_398,
                                             &local_3a0,&local_3a8);
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super2");
                                  if ((bVar1) &&
                                     (bVar1 = std::operator==(objJ_local,"sphere1"), bVar1)) {
                                    pd = 1.4183711535435;
                                    dp1.m_z = 1.4183711535435;
                                    local_3b0 = -2.4779023328493;
                                    local_3b8 = -0.32669997190278;
                                    local_3c0 = 1.0113296028496;
                                    CD_Matrix::Vector3T<double,_false>::Set
                                              ((Vector3T<double,_false> *)local_60,&local_3b0,
                                               &local_3b8,&local_3c0);
                                    local_3c8 = -2.1762353652203;
                                    local_3d0 = 0.8129674455965;
                                    local_3d8 = 0.84243208458626;
                                    CD_Matrix::Vector3T<double,_false>::Set
                                              ((Vector3T<double,_false> *)local_90,&local_3c8,
                                               &local_3d0,&local_3d8);
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super3");
                                    if ((bVar1) &&
                                       (bVar1 = std::operator==(objJ_local,"sphere1"), bVar1)) {
                                      pd = 7.4743489107843;
                                      dp1.m_z = 7.4743489107843;
                                      local_3e0 = -0.53702693775031;
                                      local_3e8 = 0.31921777729824;
                                      local_3f0 = -1.6803624586656;
                                      CD_Matrix::Vector3T<double,_false>::Set
                                                ((Vector3T<double,_false> *)local_60,&local_3e0,
                                                 &local_3e8,&local_3f0);
                                      local_3f8 = -1.9453484492689;
                                      local_400 = 1.0228264075222;
                                      local_408 = 0.55479174774896;
                                      CD_Matrix::Vector3T<double,_false>::Set
                                                ((Vector3T<double,_false> *)local_90,&local_3f8,
                                                 &local_400,&local_408);
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box1");
                                      if ((bVar1) &&
                                         (bVar1 = std::operator==(objJ_local,"sphere1"), bVar1)) {
                                        pd = 3.9663117059915;
                                        dp1.m_z = 3.9663117059915;
                                        local_410 = -0.26442597555482;
                                        local_418 = 0.15199775567757;
                                        local_420 = -0.19156797444484;
                                        CD_Matrix::Vector3T<double,_false>::Set
                                                  ((Vector3T<double,_false> *)local_60,&local_410,
                                                   &local_418,&local_420);
                                        local_428 = -1.8596364794099;
                                        local_430 = 0.9758575176791;
                                        local_438 = 0.6703312348231;
                                        CD_Matrix::Vector3T<double,_false>::Set
                                                  ((Vector3T<double,_false> *)local_90,&local_428,
                                                   &local_430,&local_438);
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box2");
                                        if ((bVar1) &&
                                           (bVar1 = std::operator==(objJ_local,"sphere1"), bVar1)) {
                                          pd = 1.7772851599536;
                                          dp1.m_z = 1.7772851599536;
                                          local_440 = -1.6006569697181;
                                          local_448 = -0.40929377232158;
                                          local_450 = 1.1739828310352;
                                          CD_Matrix::Vector3T<double,_false>::Set
                                                    ((Vector3T<double,_false> *)local_60,&local_440,
                                                     &local_448,&local_450);
                                          local_458 = -2.0082863828167;
                                          local_460 = 0.82274676021845;
                                          local_468 = 0.86869682135086;
                                          CD_Matrix::Vector3T<double,_false>::Set
                                                    ((Vector3T<double,_false> *)local_90,&local_458,
                                                     &local_460,&local_468);
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box3");
                                          if ((bVar1) &&
                                             (bVar1 = std::operator==(objJ_local,"sphere1"), bVar1))
                                          {
                                            pd = 0.40873492947483;
                                            dp1.m_z = 0.40873492947483;
                                            local_470 = -1.4233798793513;
                                            local_478 = 0.48324374143217;
                                            local_480 = 1.0100607143038;
                                            CD_Matrix::Vector3T<double,_false>::Set
                                                      ((Vector3T<double,_false> *)local_60,
                                                       &local_470,&local_478,&local_480);
                                            local_488 = -1.883840797678;
                                            local_490 = 0.90317898477367;
                                            local_498 = 0.86735450011444;
                                            CD_Matrix::Vector3T<double,_false>::Set
                                                      ((Vector3T<double,_false> *)local_90,
                                                       &local_488,&local_490,&local_498);
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super1");
                                            if ((bVar1) &&
                                               (bVar1 = std::operator==(objJ_local,"sphere2"), bVar1
                                               )) {
                                              pd = 0.039104898627535;
                                              dp1.m_z = 0.039104898627535;
                                              local_4a0 = 1.6781720909763;
                                              local_4a8 = 0.57648753892597;
                                              local_4b0 = -0.21331741131897;
                                              CD_Matrix::Vector3T<double,_false>::Set
                                                        ((Vector3T<double,_false> *)local_60,
                                                         &local_4a0,&local_4a8,&local_4b0);
                                              local_4b8 = 1.7976914901379;
                                              local_4c0 = 0.7248905617555;
                                              local_4c8 = -0.26619987217934;
                                              CD_Matrix::Vector3T<double,_false>::Set
                                                        ((Vector3T<double,_false> *)local_90,
                                                         &local_4b8,&local_4c0,&local_4c8);
                                            }
                                            else {
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super2");
                                              if ((bVar1) &&
                                                 (bVar1 = std::operator==(objJ_local,"sphere2"),
                                                 bVar1)) {
                                                pd = 18.906059441351;
                                                dp1.m_z = 18.906059441351;
                                                local_4d0 = -2.0166352552171;
                                                local_4d8 = -0.84324192220842;
                                                local_4e0 = 1.2677212945354;
                                                CD_Matrix::Vector3T<double,_false>::Set
                                                          ((Vector3T<double,_false> *)local_60,
                                                           &local_4d0,&local_4d8,&local_4e0);
                                                local_4e8 = 1.6754467644156;
                                                local_4f0 = 0.89957633685848;
                                                local_4f8 = -0.22799736802078;
                                                CD_Matrix::Vector3T<double,_false>::Set
                                                          ((Vector3T<double,_false> *)local_90,
                                                           &local_4e8,&local_4f0,&local_4f8);
                                              }
                                              else {
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super3");
                                                if ((bVar1) &&
                                                   (bVar1 = std::operator==(objJ_local,"sphere2"),
                                                   bVar1)) {
                                                  pd = 0.096550440397139;
                                                  dp1.m_z = 0.096550440397139;
                                                  local_500 = 1.6697745078346;
                                                  local_508 = 1.1266310160472;
                                                  local_510 = -1.0866387839319;
                                                  CD_Matrix::Vector3T<double,_false>::Set
                                                            ((Vector3T<double,_false> *)local_60,
                                                             &local_500,&local_508,&local_510);
                                                  local_518 = 1.8346899699717;
                                                  local_520 = 1.116376050407;
                                                  local_528 = -0.82348832046098;
                                                  CD_Matrix::Vector3T<double,_false>::Set
                                                            ((Vector3T<double,_false> *)local_90,
                                                             &local_518,&local_520,&local_528);
                                                }
                                                else {
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box1");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere2"),
                                                     bVar1)) {
                                                    pd = 3.4928506703209;
                                                    dp1.m_z = 3.4928506703209;
                                                    local_530 = -0.056687617849561;
                                                    local_538 = 0.13575086229484;
                                                    local_540 = -0.22483311680702;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_530,&local_538,&local_540);
                                                    local_548 = 1.6443705367279;
                                                    local_550 = 0.89739891750289;
                                                    local_558 = -0.3631951963815;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_548,&local_550,&local_558);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box2");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere2"),
                                                     bVar1)) {
                                                    pd = 13.535796551098;
                                                    dp1.m_z = 13.535796551098;
                                                    local_560 = -1.4206285779347;
                                                    local_568 = -0.3034386790228;
                                                    local_570 = 1.3608007525762;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_560,&local_568,&local_570);
                                                    local_578 = 1.679309305274;
                                                    local_580 = 0.93099892363515;
                                                    local_588 = -0.18914940032874;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_578,&local_580,&local_588);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box3");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere2"),
                                                     bVar1)) {
                                                    pd = 4.9068928394991;
                                                    dp1.m_z = 4.9068928394991;
                                                    local_590 = -0.10352367186681;
                                                    local_598 = 0.018083890456479;
                                                    local_5a0 = 0.76016554875608;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_590,&local_598,&local_5a0);
                                                    local_5a8 = 1.6940746685943;
                                                    local_5b0 = 0.90096107279478;
                                                    local_5b8 = -0.18643939882083;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_5a8,&local_5b0,&local_5b8);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"sphere1");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere2"),
                                                     bVar1)) {
                                                    pd = 12.731096153983;
                                                    dp1.m_z = 12.731096153983;
                                                    local_5c0 = -1.8114862908327;
                                                    local_5c8 = 1.1;
                                                    local_5d0 = 0.71778175614537;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_5c0,&local_5c8,&local_5d0);
                                                    local_5d8 = 1.6191438180545;
                                                    local_5e0 = 1.1;
                                                    local_5e8 = -0.26296959357561;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_5d8,&local_5e0,&local_5e8);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super1");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    pd = 0.43645502641181;
                                                    dp1.m_z = 0.43645502641181;
                                                    local_5f0 = 1.6912459612619;
                                                    local_5f8 = 0.567053610651;
                                                    local_600 = -0.20657129901502;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_5f0,&local_5f8,&local_600);
                                                    local_608 = 2.158681625653;
                                                    local_610 = 0.97605586976899;
                                                    local_618 = -0.43168477729525;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_608,&local_610,&local_618);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super2");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    pd = 23.550195655262;
                                                    dp1.m_z = 23.550195655262;
                                                    local_620 = -1.9924580739264;
                                                    local_628 = -0.87944172212693;
                                                    local_630 = 1.2854835093993;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_620,&local_628,&local_630);
                                                    local_638 = 2.1300977188898;
                                                    local_640 = 1.0216519471083;
                                                    local_648 = -0.42932617426062;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_638,&local_640,&local_648);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"super3");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    pd = 0.42972022695158;
                                                    dp1.m_z = 0.42972022695158;
                                                    local_650 = 1.7058063536863;
                                                    local_658 = 1.1636066171891;
                                                    local_660 = -1.112225860713;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_650,&local_658,&local_660);
                                                    local_668 = 2.1610693162235;
                                                    local_670 = 1.1148044581997;
                                                    local_678 = -0.64310518202643;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_668,&local_670,&local_678);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box1");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    pd = 5.5750152536297;
                                                    dp1.m_z = 5.5750152536297;
                                                    local_680 = -0.056687617849561;
                                                    local_688 = 0.13575086229484;
                                                    local_690 = -0.22483311680702;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_680,&local_688,&local_690);
                                                    local_698 = 2.1157485332466;
                                                    local_6a0 = 1.0251955369043;
                                                    local_6a8 = -0.47865311966162;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_698,&local_6a0,&local_6a8);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box2");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    pd = 17.558511336885;
                                                    dp1.m_z = 17.558511336885;
                                                    local_6b0 = -1.4288100961977;
                                                    local_6b8 = -0.31186268568159;
                                                    local_6c0 = 1.3377283222371;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_6b0,&local_6b8,&local_6c0);
                                                    local_6c8 = 2.130156805579;
                                                    local_6d0 = 1.0356334715405;
                                                    local_6d8 = -0.41627282805178;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_6c8,&local_6d0,&local_6d8);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"box3");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    pd = 7.4049800506603;
                                                    dp1.m_z = 7.4049800506603;
                                                    local_6e0 = -0.11233115341526;
                                                    local_6e8 = -0.0045702874952087;
                                                    local_6f0 = 0.72231113656579;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_6e0,&local_6e8,&local_6f0);
                                                    local_6f8 = 2.1346488277106;
                                                    local_700 = 1.0246599452678;
                                                    local_708 = -0.41643648386935;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_6f8,&local_700,&local_708);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"sphere1");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    pd = 16.711972710807;
                                                    dp1.m_z = 16.711972710807;
                                                    local_710 = -1.8123385444469;
                                                    local_718 = 1.1;
                                                    local_720 = 0.71484785975054;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_710,&local_718,&local_720);
                                                    local_728 = 2.1082256962979;
                                                    local_730 = 1.1;
                                                    local_738 = -0.44323190650036;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_728,&local_730,&local_738);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)distance_local,"sphere2");
                                                  if ((bVar1) &&
                                                     (bVar1 = std::operator==(objJ_local,"sphere3"),
                                                     bVar1)) {
                                                    dp1.m_z = 0.0;
                                                    pd = -0.22676975704217;
                                                    local_740 = 2.5376620746762;
                                                    local_748 = 1.098724063024;
                                                    local_750 = -0.64109671750724;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_60,
                                                               &local_740,&local_748,&local_750);
                                                    local_758 = 2.1249351701295;
                                                    local_760 = 1.1005103747904;
                                                    dStack_768 = -0.40356131299711;
                                                    CD_Matrix::Vector3T<double,_false>::Set
                                                              ((Vector3T<double,_false> *)local_90,
                                                               &local_758,&local_760,
                                                               &stack0xfffffffffffff898);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  epsilon._7_1_ = 1;
  pepsilon = 1e-06;
  local_780 = 1e-06;
  std::operator+(&local_800,"distance (",objJ_local);
  std::operator+(&local_7e0,&local_800,", ");
  std::operator+(&local_7c0,&local_7e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)distance_local
                );
  std::operator+(&local_7a0,&local_7c0,"): ");
  bVar1 = compare<double>(&penetration_local,&pd,&local_7a0,pepsilon);
  local_99a = 0;
  if (bVar1) {
    local_99a = epsilon._7_1_;
  }
  epsilon._7_1_ = local_99a & 1;
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_800);
  std::operator+(&local_890,"penetration (",objJ_local);
  std::operator+(&local_870,&local_890,", ");
  std::operator+(&local_850,&local_870,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)distance_local
                );
  std::operator+(&local_830,&local_850,"): ");
  bVar1 = compare<double>((double *)&p1_local,&dp1.m_z,&local_830,pepsilon);
  local_9aa = 0;
  if (bVar1) {
    local_9aa = epsilon._7_1_;
  }
  epsilon._7_1_ = local_9aa & 1;
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_890);
  a_00 = p2_local;
  std::operator+(&local_910,"p1 (",objJ_local);
  std::operator+(&local_8f0,&local_910,", ");
  std::operator+(&local_8d0,&local_8f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)distance_local
                );
  std::operator+(&local_8b0,&local_8d0,"): ");
  bVar1 = compare(a_00,(Vector3 *)local_60,&local_8b0,local_780);
  local_9c2 = 0;
  if (bVar1) {
    local_9c2 = epsilon._7_1_;
  }
  epsilon._7_1_ = local_9c2 & 1;
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_910);
  a = dd;
  std::operator+(&local_990,"p2 (",objJ_local);
  std::operator+(&local_970,&local_990,", ");
  std::operator+(&local_950,&local_970,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)distance_local
                );
  std::operator+(&local_930,&local_950,"): ");
  bVar1 = compare((Vector3 *)a,(Vector3 *)local_90,&local_930,local_780);
  local_9da = 0;
  if (bVar1) {
    local_9da = epsilon._7_1_;
  }
  epsilon._7_1_ = local_9da & 1;
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_990);
  return (bool)(epsilon._7_1_ & 1);
}

Assistant:

bool verifyResult(const std::string & objI, const std::string & objJ,
                  double distance, double penetration,
                  const Point3 & p1, const Point3 & p2)
{
  std::cerr.precision(14);

  double dd(0);
  double pd(0);
  Point3 dp1(0, 0, 0);
  Point3 dp2(0, 0, 0);

  if(objJ == "super1" && objI == "super2")
  {
    dd = 5.4487471575136;
    pd = 5.4487471575136;
    dp1.Set(0.28175284289769, -0.14299067182235, 1.1716656444909);
    dp2.Set(-1.7636106455221, -1.2250286690872, 1.4789588761567);
  }
  else if(objJ == "super1" && objI == "super3")
  {
    dd = 0.30421039852355;
    pd = 0.30421039852355;
    dp1.Set(0.96363716178523, 0.46511130288262, -0.52236418422971);
    dp2.Set(0.98382992853513, 0.57131577169444, -1.0632183803851);
  }
  else if(objJ == "super2" && objI == "super3")
  {
    dd = 9.9181149823984;
    pd = 9.9181149823984;
    dp1.Set(-2.2982641001418, -0.53893477159955, 1.0585206046519);
    dp2.Set(-0.63840167210456, -0.44938462670065, -1.6163536865882);
  }
  else if(objJ == "super1" && objI == "box1")
  {
    dd = 0.55758708510798;
    pd = 0.55758708510798;
    dp1.Set(0.61084807024591, 0.29440863418974, 0.069803781161034);
    dp2.Set(-0.056687617849561, 0.13575086229484, -0.22483311680702);
  }
  else if(objJ == "super2" && objI == "box1")
  {
    dd = 5.9443143905268;
    pd = 5.9443143905268;
    dp1.Set(-2.1732498476818, -0.63004749575528, 1.1490992568704);
    dp2.Set(-0.27631829569933, 0.12220296114932, -0.18509875231225);
  }
  else if(objJ == "super3" && objI == "box1")
  {
    dd = 0.51584655618165;
    pd = 0.51584655618165;
    dp1.Set(0.12785132793314, 0.015765330308717, -1.2847741886342);
    dp2.Set(-0.12368170430067, 0.077797038850676, -0.61490124768775);
  }
  else if(objJ == "super1" && objI == "box2")
  {
    dd = 2.78972586142;
    pd = 2.78972586142;
    dp1.Set(0.27677566692662, -0.13314609360976, 1.1658328403376);
    dp2.Set(-1.2995880118717, -0.57154615294118, 1.5014051895616);
  }
  else if(objJ == "super2" && objI == "box2")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(-2.4382016429023, -0.34453137974329, 1.0149926815109);
    dp2.Set(-2.8034902987202, -1.9213950463338, 0.1711823973004);
#else
    dd = -0.31718567003746;
    dp1.Set(-1.787265308154, -1.1960497354292, 1.4450521781144);
    dp2.Set(-2.2686354608106, -1.3706878827971, 1.6795089196526);
#endif
  }
  else if(objJ == "super3" && objI == "box2")
  {
    dd = 3.440763819841;
    pd = 3.440763819841;
    dp1.Set(-0.83748878593566, -0.54621539306324, -1.7742688055859);
    dp2.Set(-2.060158969655, -0.96192382874358, -0.44271785342942);
  }
  else if(objJ == "box1" && objI == "box2")
  {
    dd = 3.1102603339576;
    pd = 3.1102603339576;
    dp1.Set(-0.27631829569933, 0.12220296114932, -0.18509875231225);
    dp2.Set(-1.6979671687682, -0.58899718550305, 0.57868732183491);
  }
  else if(objJ == "super1" && objI == "box3")
  {
    dd = 0.14762346168417;
    pd = 0.14762346168417;
    dp1.Set(0.29961124339566, 0.014926401743127, 0.97819026233414);
    dp2.Set(-0.067084392233482, 0.11181124267447, 0.91678097889576);
  }
  else if(objJ == "super2" && objI == "box3")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(-1.9129702551419, -1.8621316732081, 1.5487339817517);
    dp2.Set(-3.6588197853564, -1.4067952284442, 2.6612783998353);
#else
    dd = -0.88486848336054;
    dp1.Set(-1.8258028062901, -1.2035457346373, 1.5672994449862);
    dp2.Set(-2.0099706249296, -1.6772532880947, 0.77574916121672);
#endif
  }
  else if(objJ == "super3" && objI == "box3")
  {
    dd = 1.2943618702035;
    pd = 1.2943618702035;
    dp1.Set(-0.2536866871953, -0.23957739656524, -1.4216076267573);
    dp2.Set(-0.65088388966599, -0.31132657081448, -0.35791203658708);
  }
  else if(objJ == "box1" && objI == "box3")
  {
    dd = 0.16648542041871;
    pd = 0.16648542041871;
    dp1.Set(-0.27631829569933, 0.12220296114932, -0.18509875231225);
    dp2.Set(-0.54770561715496, -0.10725192694837, 0.015362706576795);
  }
  else if(objJ == "box2" && objI == "box3")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(-2.060158969655, -0.96192382874358, -0.44271785342942);
    dp2.Set(-2.7940854586392, -2.1938370874621, 2.9310925142747);
#else
    dd = -1.7306786763394;
    dp1.Set(-1.1518981590561, -1.0179317129611, 1.6120145906702);
    dp2.Set(-2.0999010779384, -0.15510256812534, 1.3162190380463);
#endif
  }
  else if(objJ == "super1" && objI == "sphere1")
  {
    dd = 5.3186326388713;
    pd = 5.3186326388713;
    dp1.Set(0.3354800425203, 0.22033997371372, 1.0949514789063);
    dp2.Set(-1.8196178883092, 0.99878520299519, 0.83378376954228);
  }
  else if(objJ == "super2" && objI == "sphere1")
  {
    dd = 1.4183711535435;
    pd = 1.4183711535435;
    dp1.Set(-2.4779023328493, -0.32669997190278, 1.0113296028496);
    dp2.Set(-2.1762353652203, 0.8129674455965, 0.84243208458626);
  }
  else if(objJ == "super3" && objI == "sphere1")
  {
    dd = 7.4743489107843;
    pd = 7.4743489107843;
    dp1.Set(-0.53702693775031, 0.31921777729824, -1.6803624586656);
    dp2.Set(-1.9453484492689, 1.0228264075222, 0.55479174774896);
  }
  else if(objJ == "box1" && objI == "sphere1")
  {
    dd = 3.9663117059915;
    pd = 3.9663117059915;
    dp1.Set(-0.26442597555482, 0.15199775567757, -0.19156797444484);
    dp2.Set(-1.8596364794099, 0.9758575176791, 0.6703312348231);
  }
  else if(objJ == "box2" && objI == "sphere1")
  {
    dd = 1.7772851599536;
    pd = 1.7772851599536;
    dp1.Set(-1.6006569697181, -0.40929377232158, 1.1739828310352);
    dp2.Set(-2.0082863828167, 0.82274676021845, 0.86869682135086);
  }
  else if(objJ == "box3" && objI == "sphere1")
  {
    dd = 0.40873492947483;
    pd = 0.40873492947483;
    dp1.Set(-1.4233798793513, 0.48324374143217, 1.0100607143038);
    dp2.Set(-1.883840797678, 0.90317898477367, 0.86735450011444);
  }
  else if(objJ == "super1" && objI == "sphere2")
  {
    dd = 0.039104898627535;
    pd = 0.039104898627535;
    dp1.Set(1.6781720909763, 0.57648753892597, -0.21331741131897);
    dp2.Set(1.7976914901379, 0.7248905617555, -0.26619987217934);
  }
  else if(objJ == "super2" && objI == "sphere2")
  {
    dd = 18.906059441351;
    pd = 18.906059441351;
    dp1.Set(-2.0166352552171, -0.84324192220842, 1.2677212945354);
    dp2.Set(1.6754467644156, 0.89957633685848, -0.22799736802078);
  }
  else if(objJ == "super3" && objI == "sphere2")
  {
    dd = 0.096550440397139;
    pd = 0.096550440397139;
    dp1.Set(1.6697745078346, 1.1266310160472, -1.0866387839319);
    dp2.Set(1.8346899699717, 1.116376050407, -0.82348832046098);
  }
  else if(objJ == "box1" && objI == "sphere2")
  {
    dd = 3.4928506703209;
    pd = 3.4928506703209;
    dp1.Set(-0.056687617849561, 0.13575086229484, -0.22483311680702);
    dp2.Set(1.6443705367279, 0.89739891750289, -0.3631951963815);
  }
  else if(objJ == "box2" && objI == "sphere2")
  {
    dd = 13.535796551098;
    pd = 13.535796551098;
    dp1.Set(-1.4206285779347, -0.3034386790228, 1.3608007525762);
    dp2.Set(1.679309305274, 0.93099892363515, -0.18914940032874);
  }
  else if(objJ == "box3" && objI == "sphere2")
  {
    dd = 4.9068928394991;
    pd = 4.9068928394991;
    dp1.Set(-0.10352367186681, 0.018083890456479, 0.76016554875608);
    dp2.Set(1.6940746685943, 0.90096107279478, -0.18643939882083);
  }
  else if(objJ == "sphere1" && objI == "sphere2")
  {
    dd = 12.731096153983;
    pd = 12.731096153983;
    dp1.Set(-1.8114862908327, 1.1, 0.71778175614537);
    dp2.Set(1.6191438180545, 1.1, -0.26296959357561);
  }
  else if(objJ == "super1" && objI == "sphere3")
  {
    dd = 0.43645502641181;
    pd = 0.43645502641181;
    dp1.Set(1.6912459612619, 0.567053610651, -0.20657129901502);
    dp2.Set(2.158681625653, 0.97605586976899, -0.43168477729525);
  }
  else if(objJ == "super2" && objI == "sphere3")
  {
    dd = 23.550195655262;
    pd = 23.550195655262;
    dp1.Set(-1.9924580739264, -0.87944172212693, 1.2854835093993);
    dp2.Set(2.1300977188898, 1.0216519471083, -0.42932617426062);
  }
  else if(objJ == "super3" && objI == "sphere3")
  {
    dd = 0.42972022695158;
    pd = 0.42972022695158;
    dp1.Set(1.7058063536863, 1.1636066171891, -1.112225860713);
    dp2.Set(2.1610693162235, 1.1148044581997, -0.64310518202643);
  }
  else if(objJ == "box1" && objI == "sphere3")
  {
    dd = 5.5750152536297;
    pd = 5.5750152536297;
    dp1.Set(-0.056687617849561, 0.13575086229484, -0.22483311680702);
    dp2.Set(2.1157485332466, 1.0251955369043, -0.47865311966162);
  }
  else if(objJ == "box2" && objI == "sphere3")
  {
    dd = 17.558511336885;
    pd = 17.558511336885;
    dp1.Set(-1.4288100961977, -0.31186268568159, 1.3377283222371);
    dp2.Set(2.130156805579, 1.0356334715405, -0.41627282805178);
  }
  else if(objJ == "box3" && objI == "sphere3")
  {
    dd = 7.4049800506603;
    pd = 7.4049800506603;
    dp1.Set(-0.11233115341526, -0.0045702874952087, 0.72231113656579);
    dp2.Set(2.1346488277106, 1.0246599452678, -0.41643648386935);
  }
  else if(objJ == "sphere1" && objI == "sphere3")
  {
    dd = 16.711972710807;
    pd = 16.711972710807;
    dp1.Set(-1.8123385444469, 1.1, 0.71484785975054);
    dp2.Set(2.1082256962979, 1.1, -0.44323190650036);
  }
  else if(objJ == "sphere2" && objI == "sphere3")
  {
    pd = 0;
#ifdef SCH_BUILD_BSD
    dd = 0;
    dp1.Set(2.1492688089833, 1.1, -0.89756666333404);
    dp2.Set(2.2802924764067, 1.1, -0.30097333466639);
#else
    dd = -0.22676975704217;
    dp1.Set(2.5376620746762, 1.098724063024, -0.64109671750724);
    dp2.Set(2.1249351701295, 1.1005103747904, -0.40356131299711);
#endif
  }

  bool res = true;

  double epsilon = 1e-6;
  double pepsilon = epsilon;

#if defined __i386__ || defined __aarch64__
  epsilon = 1e-4;
  pepsilon = 1e-1;
#endif

  res = compare(distance, dd, "distance ("+objI +", "+objJ+"): ", epsilon) && res;
  res = compare(penetration, pd, "penetration ("+objI +", "+objJ+"): ", epsilon) && res;
  res = compare(p1, dp1, "p1 ("+objI +", "+objJ+"): ", pepsilon) && res;
  res = compare(p2, dp2, "p2 ("+objI +", "+objJ+"): ", pepsilon) && res;
  return res;
}